

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::VecAttributesImpl::getURI(VecAttributesImpl *this,XMLSize_t index)

{
  XMLScanner *this_00;
  uint uriId;
  XMLAttr *this_01;
  XMLSize_t index_local;
  VecAttributesImpl *this_local;
  
  if (index < this->fCount) {
    this_00 = this->fScanner;
    this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,index);
    uriId = XMLAttr::getURIId(this_01);
    this_local = (VecAttributesImpl *)XMLScanner::getURIText(this_00,uriId);
  }
  else {
    this_local = (VecAttributesImpl *)0x0;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* VecAttributesImpl::getURI(const XMLSize_t index) const
{
    // since this func really needs to be const, like the rest, not sure how we
    // make it const and re-use the fURIBuffer member variable.  we're currently
    // creating a buffer each time you need a URI.  there has to be a better
    // way to do this...

    //XMLBuffer tempBuf;
    if (index >= fCount) {


        return 0;
     }
    //fValidator->getURIText(fVector->elementAt(index)->getURIId(), tempBuf) ;
    //return tempBuf.getRawBuffer() ;
    return fScanner->getURIText(fVector->elementAt(index)->getURIId());
}